

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O1

void add_opvars(sp_lev *sp,char *fmt,...)

{
  byte bVar1;
  char in_AL;
  undefined8 *dat;
  void **ppvVar2;
  char *pcVar3;
  undefined8 in_RCX;
  ulong uVar4;
  void *pvVar5;
  uint uVar6;
  undefined8 in_RDX;
  int opc;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  void **local_100;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_100 = &argp[0].overflow_arg_area;
  uVar6 = 0x10;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  do {
    bVar1 = *fmt;
    if (bVar1 < 0x4f) {
      if (bVar1 != 0x20) {
        if (bVar1 == 0x4d) {
          dat = (undefined8 *)malloc(0x10);
          *dat = 0;
          dat[1] = 0;
          uVar4 = (ulong)uVar6;
          if (uVar4 < 0x29) {
            uVar6 = uVar6 + 8;
            ppvVar2 = (void **)((long)local_e8 + uVar4);
          }
          else {
            ppvVar2 = local_100;
            local_100 = local_100 + 1;
          }
          if (dat != (undefined8 *)0x0) {
            pvVar5 = *ppvVar2;
            *(undefined1 *)dat = 7;
            goto LAB_0010cc0a;
          }
          goto LAB_0010cc0e;
        }
        if (bVar1 == 0) {
          return;
        }
        goto switchD_0010c920_caseD_6a;
      }
      goto LAB_0010cc31;
    }
    switch(bVar1) {
    case 0x69:
      dat = (undefined8 *)malloc(0x10);
      *dat = 0;
      dat[1] = 0;
      uVar4 = (ulong)uVar6;
      if (uVar4 < 0x29) {
        uVar6 = uVar6 + 8;
        ppvVar2 = (void **)((long)local_e8 + uVar4);
      }
      else {
        ppvVar2 = local_100;
        local_100 = local_100 + 1;
      }
      if (dat != (undefined8 *)0x0) {
        pvVar5 = *ppvVar2;
        *(undefined1 *)dat = 1;
LAB_0010cc0a:
        dat[1] = pvVar5;
      }
      break;
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x74:
    case 0x75:
switchD_0010c920_caseD_6a:
      fprintf(_stderr,"add_opvars: illegal format character \'%c\'.\n",(ulong)(uint)(int)(char)bVar1
             );
      goto LAB_0010cc31;
    case 0x6d:
      dat = (undefined8 *)malloc(0x10);
      *dat = 0;
      dat[1] = 0;
      uVar4 = (ulong)uVar6;
      if (uVar4 < 0x29) {
        uVar6 = uVar6 + 8;
        ppvVar2 = (void **)((long)local_e8 + uVar4);
      }
      else {
        ppvVar2 = local_100;
        local_100 = local_100 + 1;
      }
      if (dat != (undefined8 *)0x0) {
        pvVar5 = *ppvVar2;
        *(undefined1 *)dat = 6;
        goto LAB_0010cc0a;
      }
      break;
    case 0x6f:
      uVar4 = (ulong)uVar6;
      if (uVar4 < 0x29) {
        uVar6 = uVar6 + 8;
        ppvVar2 = (void **)((long)local_e8 + uVar4);
      }
      else {
        ppvVar2 = local_100;
        local_100 = local_100 + 1;
      }
      opc = *(int *)ppvVar2;
      if (0x4b < (ulong)(long)opc) {
        fprintf(_stderr,"add_opvars: unknown opcode \'%li\'.\n",(long)opc);
      }
      dat = (undefined8 *)0x0;
      goto LAB_0010cc2c;
    case 0x72:
      dat = (undefined8 *)malloc(0x10);
      *dat = 0;
      dat[1] = 0;
      uVar4 = (ulong)uVar6;
      if (uVar4 < 0x29) {
        uVar6 = uVar6 + 8;
        ppvVar2 = (void **)((long)local_e8 + uVar4);
      }
      else {
        ppvVar2 = local_100;
        local_100 = local_100 + 1;
      }
      if (dat != (undefined8 *)0x0) {
        pvVar5 = *ppvVar2;
        *(undefined1 *)dat = 5;
        goto LAB_0010cc0a;
      }
      break;
    case 0x73:
      dat = (undefined8 *)malloc(0x10);
      *dat = 0;
      dat[1] = 0;
      uVar4 = (ulong)uVar6;
      if (uVar4 < 0x29) {
        uVar6 = uVar6 + 8;
        ppvVar2 = (void **)((long)local_e8 + uVar4);
      }
      else {
        ppvVar2 = local_100;
        local_100 = local_100 + 1;
      }
      if (dat != (undefined8 *)0x0) {
        pcVar3 = (char *)*ppvVar2;
        *(undefined1 *)dat = 2;
LAB_0010cbca:
        if (pcVar3 == (char *)0x0) {
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = strdup(pcVar3);
        }
        dat[1] = pcVar3;
      }
      goto LAB_0010cc21;
    case 0x76:
      dat = (undefined8 *)malloc(0x10);
      *dat = 0;
      dat[1] = 0;
      uVar4 = (ulong)uVar6;
      if (uVar4 < 0x29) {
        uVar6 = uVar6 + 8;
        ppvVar2 = (void **)((long)local_e8 + uVar4);
      }
      else {
        ppvVar2 = local_100;
        local_100 = local_100 + 1;
      }
      if (dat != (undefined8 *)0x0) {
        pcVar3 = (char *)*ppvVar2;
        *(undefined1 *)dat = 3;
        goto LAB_0010cbca;
      }
LAB_0010cc21:
      opc = 0x28;
      goto LAB_0010cc2c;
    default:
      if (bVar1 == 0x4f) {
        dat = (undefined8 *)malloc(0x10);
        *dat = 0;
        dat[1] = 0;
        uVar4 = (ulong)uVar6;
        if (uVar4 < 0x29) {
          uVar6 = uVar6 + 8;
          ppvVar2 = (void **)((long)local_e8 + uVar4);
        }
        else {
          ppvVar2 = local_100;
          local_100 = local_100 + 1;
        }
        if (dat != (undefined8 *)0x0) {
          pvVar5 = *ppvVar2;
          *(undefined1 *)dat = 8;
          goto LAB_0010cc0a;
        }
      }
      else {
        if (bVar1 != 99) goto switchD_0010c920_caseD_6a;
        dat = (undefined8 *)malloc(0x10);
        *dat = 0;
        dat[1] = 0;
        uVar4 = (ulong)uVar6;
        if (uVar4 < 0x29) {
          uVar6 = uVar6 + 8;
          ppvVar2 = (void **)((long)local_e8 + uVar4);
        }
        else {
          ppvVar2 = local_100;
          local_100 = local_100 + 1;
        }
        if (dat != (undefined8 *)0x0) {
          pvVar5 = *ppvVar2;
          *(undefined1 *)dat = 4;
          goto LAB_0010cc0a;
        }
      }
    }
LAB_0010cc0e:
    opc = 0x28;
LAB_0010cc2c:
    add_opcode(sp,opc,dat);
LAB_0010cc31:
    fmt = (char *)((byte *)fmt + 1);
  } while( true );
}

Assistant:

void add_opvars(sp_lev *sp, const char *fmt, ...)
{
	const char *p;
	va_list argp;

	va_start(argp, fmt);

	for (p = fmt; *p != '\0'; p++) {
	    switch(*p) {
	    case ' ': break;
	    case 'i':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_int(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'c':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_coord(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'r':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_region(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'm':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_mapchar(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'M':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_monst(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'O':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_obj(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 's':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_str(ov, va_arg(argp, char *));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'v':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_var(ov, va_arg(argp, char *));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'o':
		{
		    long i = va_arg(argp, int);
		    if (i < 0 || i >= MAX_SP_OPCODES)
			fprintf(stderr, "add_opvars: unknown opcode '%li'.\n", i);
		    add_opcode(sp, i, NULL);
		    break;
		}
	    default:
		fprintf(stderr, "add_opvars: illegal format character '%c'.\n", *p);
		break;
	    }
	}

	va_end(argp);
}